

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

void __thiscall Interface::Run(Interface *this)

{
  ostream *poVar1;
  string sInputLine;
  string local_38;
  
  poVar1 = this->m_Out + *(long *)(*(long *)this->m_Out + -0x18) + 0x18;
  *(uint *)poVar1 = *(uint *)poVar1 | 0x2000;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  RegisterAll(this);
  AnnounceSelf(this);
  while (this->m_bIsRunning == true) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(this->m_In,(string *)&local_38);
    std::mutex::lock(&this->m_Lock);
    Execute(this,&local_38);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Lock);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Run()
    {
        m_Out->setf( ios::unitbuf );
        string sInputLine;
        RegisterAll();

        AnnounceSelf();

        while ( m_bIsRunning )
        {
            getline( *m_In, sInputLine );
            if ( m_bLogInputToFile )
                LogLineToFile( sInputLine );

            LockGuardType guard( m_Lock );
            Execute( sInputLine );
        }
    }